

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

void Z80::OpCode_LDI(void)

{
  bool bVar1;
  byte bVar2;
  char cVar3;
  Z80Reg ZVar4;
  EBracketType EVar5;
  int iVar6;
  Z80Reg ZVar7;
  undefined1 signedCheck;
  undefined8 in_RSI;
  char **ppcVar8;
  int e [14];
  Z80Reg local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  Z80Reg local_58;
  undefined8 uStack_54;
  Z80Reg ZStack_4c;
  int local_48;
  uint uStack_44;
  undefined4 uStack_40;
  Z80Reg ZStack_3c;
  undefined8 local_38;
  
  ppcVar8 = (char **)0x0;
  bVar1 = Options::noFakes(false);
  if (bVar1) {
    EmitByte(0xed,true);
    EmitByte(0xa0,false);
    return;
  }
  do {
    signedCheck = (undefined1)in_RSI;
    local_48 = -1;
    uStack_44 = 0xffffffff;
    uStack_40 = 0xffffffff;
    ZStack_3c = Z80_UNK;
    local_58 = Z80_UNK;
    uStack_54._0_4_ = 0xffffffff;
    uStack_54._4_4_ = 0xffffffff;
    ZStack_4c = Z80_UNK;
    local_68 = Z80_UNK;
    uStack_64 = 0xffffffff;
    uStack_60 = 0xffffffff;
    uStack_5c = 0xffffffff;
    local_38 = 0xffffffffffffffff;
    ZVar4 = GetRegister(ppcVar8);
    if (ZVar4 < Z80_DE) {
      switch(ZVar4) {
      case Z80_B:
      case Z80_C:
      case Z80_D:
      case Z80_E:
      case Z80_H:
      case Z80_L:
        bVar1 = comma(&lp);
        if ((bVar1) && (EVar5 = OpenBracket(&lp), EVar5 != BT_NONE)) {
          ppcVar8 = (char **)0x1;
          Options::noFakes(true);
          ZVar7 = GetRegister(ppcVar8);
          if ((ZVar7 == Z80_IY) || (ZVar7 == Z80_IX)) {
            uStack_5c = 0xfffffffe;
            uStack_64 = ZVar4 * 8 + 0x46;
            uStack_54._0_4_ = 0x23;
            bVar2 = z80GetIDxoffset(ppcVar8);
            uStack_60 = (uint)bVar2;
            iVar6 = CloseBracket(&lp);
            if (iVar6 != 0) {
              local_68 = ZVar7;
              local_58 = ZVar7;
            }
          }
          else if (ZVar7 == Z80_HL) {
            uStack_64 = 0xfffffffe;
            uStack_60 = 0x23;
            iVar6 = CloseBracket(&lp);
            if (iVar6 != 0) {
              local_68 = ZVar4 * 8 + (Z80_SP|Z80_MEM_HL);
            }
          }
        }
        break;
      case Z80_MEM_HL:
        ppcVar8 = &lp;
        bVar1 = comma(&lp);
        if (bVar1) {
          ZVar4 = GetRegister(ppcVar8);
          switch(ZVar4) {
          case Z80_B:
          case Z80_C:
          case Z80_D:
          case Z80_E:
          case Z80_H:
          case Z80_L:
          case Z80_A:
            Options::noFakes(true);
            uStack_64 = 0xfffffffe;
            uStack_60 = 0x23;
            ZVar4 = ZVar4 + (Z80_SP|Z80_HL);
            ZVar7 = local_58;
LAB_00139511:
            local_58 = ZVar7;
            local_68 = ZVar4;
            break;
          case Z80_MEM_HL:
          case Z80_I:
          case Z80_R:
          case Z80_F:
          case Z80_F|Z80_C:
          case Z80_I|Z80_H:
          case Z80_I|Z80_L:
          case Z80_I|Z80_MEM_HL:
          case Z80_I|Z80_A:
            break;
          case Z80_BC:
switchD_001394f2_caseD_10:
            Options::noFakes(true);
            uStack_54 = CONCAT44(uStack_54._4_4_,0xfffffffe);
            uStack_5c = 0xfffffffe;
            uStack_64 = 0xfffffffe;
            local_68 = GetRegister_r16Low(ZVar4);
            local_68 = local_68 + (Z80_SP|Z80_HL);
            ZVar4 = GetRegister_r16High(ZVar4);
            uStack_54._4_4_ = 0x23;
            uStack_60 = 0x23;
            local_58 = ZVar4 + (Z80_SP|Z80_HL);
            break;
          case Z80_UNK:
            Options::noFakes(true);
            uStack_60 = 0xfffffffe;
            local_68 = Z80_HL|Z80_MEM_HL;
            bVar2 = GetByteNoMem((char **)0x0,(bool)signedCheck);
            uStack_64 = (uint)bVar2;
            uStack_5c = 0x23;
            break;
          default:
            if (ZVar4 == Z80_DE) goto switchD_001394f2_caseD_10;
          }
        }
        break;
      case Z80_A:
        bVar1 = comma(&lp);
        if ((bVar1) && (EVar5 = OpenBracket(&lp), EVar5 != BT_NONE)) {
          ppcVar8 = (char **)0x1;
          Options::noFakes(true);
          ZVar4 = GetRegister(ppcVar8);
          if (ZVar4 < Z80_HL) {
            if ((ZVar4 == Z80_BC) || (ZVar4 == Z80_DE)) {
              iVar6 = CloseBracket(&lp);
              if (iVar6 != 0) {
                local_68 = ZVar4 + ~Z80_L;
              }
              goto LAB_001396f7;
            }
          }
          else if (ZVar4 == Z80_HL) {
            uStack_64 = 0xfffffffe;
            uStack_60 = 0x23;
            iVar6 = CloseBracket(&lp);
            if (iVar6 != 0) {
              local_68 = Z80_SP|Z80_HL|Z80_I|Z80_MEM_HL;
            }
          }
          else if ((ZVar4 == Z80_IX) || (ZVar4 == Z80_IY)) {
            uStack_5c = 0xfffffffe;
            uStack_64 = 0x7e;
            uStack_54._0_4_ = 0x23;
            bVar2 = z80GetIDxoffset(ppcVar8);
            uStack_60 = (uint)bVar2;
            iVar6 = CloseBracket(&lp);
            ZVar7 = ZVar4;
            if (iVar6 != 0) goto LAB_00139511;
          }
        }
        break;
      default:
        goto switchD_00139285_caseD_8;
      case Z80_BC:
switchD_00139285_caseD_10:
        ppcVar8 = &lp;
        bVar1 = comma(&lp);
        if (bVar1) {
          ZVar7 = GetRegister(ppcVar8);
          if ((ZVar7 == Z80_MEM_IY) || (ZVar7 == Z80_MEM_IX)) {
            Options::noFakes(true);
            uStack_40 = 0xfffffffe;
            uStack_5c = 0xfffffffe;
            uStack_44 = GetRegister_lastIxyD;
            uStack_60 = GetRegister_lastIxyD;
            ZStack_4c = ZVar7 & 0xff;
            uStack_64 = ZVar4 + (Z80_HL|Z80_I|Z80_MEM_HL);
            local_48 = ZVar4 + (Z80_HL|Z80_MEM_HL);
            local_38 = CONCAT44(local_38._4_4_,0x23);
            uStack_54._0_4_ = 0x23;
            uStack_54._4_4_ = 0xfffffffe;
            local_68 = ZStack_4c;
            local_58 = ZStack_4c;
            ZStack_3c = ZStack_4c;
          }
          else if ((ZVar7 == Z80_MEM_HL) && (ZVar4 != Z80_HL)) {
            Options::noFakes(true);
            uStack_54._0_4_ = 0xfffffffe;
            uStack_54._4_4_ = 0x23;
            uStack_5c = 0xfffffffe;
            uStack_64 = 0xfffffffe;
            uStack_60 = 0x23;
            local_68 = ZVar4 + (Z80_HL|Z80_I|Z80_MEM_HL);
            local_58 = ZVar4 + (Z80_HL|Z80_MEM_HL);
          }
        }
      }
    }
    else {
      if (ZVar4 < Z80_MEM_IX) {
        if ((ZVar4 == Z80_DE) || (ZVar4 == Z80_HL)) goto switchD_00139285_caseD_10;
      }
      else if ((ZVar4 == Z80_MEM_IX) || (ZVar4 == Z80_MEM_IY)) {
        ppcVar8 = &lp;
        bVar1 = comma(&lp);
        if (bVar1) {
          ZVar7 = GetRegister(ppcVar8);
          switch(ZVar7) {
          case Z80_B:
          case Z80_C:
          case Z80_D:
          case Z80_E:
          case Z80_H:
          case Z80_L:
          case Z80_A:
            Options::noFakes(true);
            uStack_5c = 0xfffffffe;
            local_68 = ZVar4 & 0xff;
            uStack_60 = GetRegister_lastIxyD;
            uStack_64 = ZVar7 + (Z80_SP|Z80_HL);
            uStack_54._0_4_ = 0x23;
            local_58 = local_68;
            break;
          case Z80_MEM_HL:
          case Z80_I:
          case Z80_R:
          case Z80_F:
          case Z80_F|Z80_C:
          case Z80_I|Z80_H:
          case Z80_I|Z80_L:
          case Z80_I|Z80_MEM_HL:
          case Z80_I|Z80_A:
            break;
          case Z80_BC:
switchD_001393ea_caseD_10:
            Options::noFakes(true);
            uStack_40 = 0xfffffffe;
            uStack_5c = 0xfffffffe;
            local_68 = ZVar4 & 0xff;
            local_38 = CONCAT44(local_38._4_4_,0x23);
            uStack_54._0_4_ = 0x23;
            uStack_54._4_4_ = 0xfffffffe;
            uStack_44 = GetRegister_lastIxyD;
            uStack_60 = GetRegister_lastIxyD;
            local_58 = local_68;
            ZStack_4c = local_68;
            ZStack_3c = local_68;
            ZVar4 = GetRegister_r16Low(ZVar7);
            uStack_64 = ZVar4 + (Z80_SP|Z80_HL);
            ZVar4 = GetRegister_r16High(ZVar7);
            local_48 = ZVar4 + (Z80_SP|Z80_HL);
            break;
          case Z80_UNK:
            Options::noFakes(true);
            local_68 = ZVar4 & 0xff;
            uStack_54 = CONCAT44(uStack_54._4_4_,ZVar4) & 0xffffffff000000ff;
            uStack_64 = 0x36;
            uStack_60 = GetRegister_lastIxyD;
            bVar2 = GetByteNoMem((char **)0x0,(bool)signedCheck);
            uStack_5c = (uint)bVar2;
            local_58 = ~Z80_C;
            uStack_54._4_4_ = 0x23;
            break;
          default:
            if ((ZVar7 == Z80_DE) || (ZVar7 == Z80_HL)) goto switchD_001393ea_caseD_10;
          }
        }
        goto switchD_001393ea_caseD_6;
      }
switchD_00139285_caseD_8:
      ppcVar8 = &lp;
      EVar5 = OpenBracket(&lp);
      if (EVar5 == BT_NONE) {
        local_68 = 0xed;
        uStack_64 = 0xa0;
      }
      else {
        ZVar4 = GetRegister(ppcVar8);
        iVar6 = CloseBracket(&lp);
        if (iVar6 != 0) {
          ppcVar8 = &lp;
          bVar1 = comma(&lp);
          if ((bVar1) &&
             (((ZVar4 == Z80_DE || (ZVar4 == Z80_BC)) &&
              (ZVar7 = GetRegister(ppcVar8), ZVar7 == Z80_A)))) {
            Options::noFakes(true);
            local_68 = ZVar4 + ~(Z80_I|Z80_L);
LAB_001396f7:
            uStack_64 = 0xfffffffe;
            uStack_60 = ZVar4 + ~(Z80_I|Z80_H);
          }
        }
      }
    }
switchD_001393ea_caseD_6:
    in_RSI = 1;
    EmitBytes(&local_68,true);
    ppcVar8 = &lp;
    cVar3 = (*DAT_0018e520)();
    if (cVar3 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

static void OpCode_LDI() {
		if (Options::noFakes(false)) {
			EmitByte(0xED, true);
			EmitByte(0xA0);
			return;
		}

		// only when fakes are enabled (but they may be silent/warning enabled, so extra checks needed)
		do {
			int e[] { -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1, -1 };
			Z80Reg reg2 = Z80_UNK, reg = GetRegister(lp);
			switch (reg) {
			case Z80_A:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg = GetRegister(lp)) {
				case Z80_BC:	// 0A 03
				case Z80_DE:	// 1A 13
					if (CloseBracket(lp)) e[0] = reg - Z80_BC + 0x0a;
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = reg - Z80_BC + 0x03;
					break;
				case Z80_HL:
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23;
					if (CloseBracket(lp)) e[0] = 0x7e;
					break;
				case Z80_IX:
				case Z80_IY:
					e[3] = INSTRUCTION_START_MARKER;
					e[1] = 0x7e; e[5] = 0x23; e[2] = z80GetIDxoffset(lp);
					if (CloseBracket(lp)) e[0] = e[4] = reg;
					break;
				default:
					break;
				}
				break;
			case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
				if (!comma(lp)) break;
				if (BT_NONE == OpenBracket(lp)) break;
				Options::noFakes();		// to display warning if "-f"
				switch (reg2 = GetRegister(lp)) {
				case Z80_HL:
					e[1] = INSTRUCTION_START_MARKER;
					e[2] = 0x23; if (CloseBracket(lp)) e[0] = 0x46 + reg * 8;
					break;
				case Z80_IX:
				case Z80_IY:
					e[3] = INSTRUCTION_START_MARKER;
					e[1] = 0x46 + reg * 8; e[5] = 0x23; e[2] = z80GetIDxoffset(lp);
					if (CloseBracket(lp)) e[0] = e[4] = reg2;
					break;
				default:
					break;
				}
				break;
			case Z80_BC: case Z80_DE: case Z80_HL:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_MEM_HL:
					if (Z80_HL == reg) break;
					Options::noFakes();		// to display warning if "-f"
					e[1] = e[3] = e[5] = INSTRUCTION_START_MARKER;
					e[0] = 0x3e + reg;
					e[2] = 0x23;
					e[4] = 0x36 + reg;
					e[6] = 0x23;
					break;
				case Z80_MEM_IX: case Z80_MEM_IY:
					Options::noFakes();		// to display warning if "-f"
					e[3] = e[6] = e[10] = INSTRUCTION_START_MARKER;
					e[2] = e[9] = GetRegister_lastIxyD;
					e[0] = e[4] = e[7] = e[11] = reg2&0xFF;
					e[1] = 0x3e + reg; e[8] = 0x36 + reg; e[5] = e[12] = 0x23;
					break;
				default:
					break;
				}
				break;
			case Z80_MEM_HL:
				if (!comma(lp)) break;
				switch (reg = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[1] = INSTRUCTION_START_MARKER;
					e[0] = 0x70 + reg; e[2] = 0x23; break;
				case Z80_BC: case Z80_DE:
					Options::noFakes();		// to display warning if "-f"
					e[1] = e[3] = e[5] = INSTRUCTION_START_MARKER;
					e[0] = 0x70 + GetRegister_r16Low(reg); e[4] = 0x70 + GetRegister_r16High(reg);
					e[2] = e[6] = 0x23; break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[2] = INSTRUCTION_START_MARKER;
					e[0] = 0x36; e[1] = GetByteNoMem(lp); e[3] = 0x23; break;
				default:
					break;
				}
				break;
			case Z80_MEM_IX: case Z80_MEM_IY:
				if (!comma(lp)) break;
				switch (reg2 = GetRegister(lp)) {
				case Z80_A: case Z80_B: case Z80_C: case Z80_D: case Z80_E: case Z80_H: case Z80_L:
					Options::noFakes();		// to display warning if "-f"
					e[3] = INSTRUCTION_START_MARKER;
					e[0] = e[4] = reg&0xFF; e[2] = GetRegister_lastIxyD; e[1] = 0x70 + reg2; e[5] = 0x23; break;
				case Z80_BC: case Z80_DE: case Z80_HL:
					Options::noFakes();		// to display warning if "-f"
					e[3] = e[6] = e[10] = INSTRUCTION_START_MARKER;
					e[0] = e[4] = e[7] = e[11] = reg&0xFF; e[5] = e[12] = 0x23; e[2] = e[9] = GetRegister_lastIxyD;
					e[1] = 0x70 + GetRegister_r16Low(reg2); e[8] = 0x70 + GetRegister_r16High(reg2); break;
				case Z80_UNK:
					Options::noFakes();		// to display warning if "-f"
					e[0] = e[5] = reg&0xFF; e[1] = 0x36; e[2] = GetRegister_lastIxyD; e[3] = GetByteNoMem(lp);
					e[4] = INSTRUCTION_START_MARKER;
					e[6] = 0x23; break;
				default:
					break;
				}
				break;
			default:
				if (BT_NONE != OpenBracket(lp)) {
					reg = GetRegister(lp);
					if (!CloseBracket(lp) || !comma(lp)) break;
					if ((Z80_BC != reg && Z80_DE != reg) || Z80_A != GetRegister(lp)) break;
					Options::noFakes();
					e[1] = INSTRUCTION_START_MARKER;
					e[0] = reg - 14; e[2] = reg - 13;	// LDI (bc|de),a
				} else {
					e[0] = 0xed; e[1] = 0xa0;			// regular LDI
				}
			}

			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
	}